

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlFirstElementChild(xmlNodePtr parent)

{
  xmlNodePtr pxVar1;
  
  if (parent != (xmlNodePtr)0x0) {
    if (XML_HTML_DOCUMENT_NODE < parent->type) {
      return (xmlNodePtr)0x0;
    }
    if ((0x2a42U >> (parent->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      return (xmlNodePtr)0x0;
    }
    for (pxVar1 = parent->children; pxVar1 != (xmlNodePtr)0x0; pxVar1 = pxVar1->next) {
      if (pxVar1->type == XML_ELEMENT_NODE) {
        return pxVar1;
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlFirstElementChild(xmlNodePtr parent) {
    xmlNodePtr cur = NULL;

    if (parent == NULL)
        return(NULL);
    switch (parent->type) {
        case XML_ELEMENT_NODE:
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_HTML_DOCUMENT_NODE:
            cur = parent->children;
            break;
        default:
            return(NULL);
    }
    while (cur != NULL) {
        if (cur->type == XML_ELEMENT_NODE)
            return(cur);
        cur = cur->next;
    }
    return(NULL);
}